

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack29_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1fffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1d;
  *puVar1 = (in[1] & 0x3ffffff) << 3 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x1a;
  *puVar1 = (in[2] & 0x7fffff) << 6 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x17;
  *puVar1 = (in[3] & 0xfffff) << 9 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x14;
  *puVar1 = (in[4] & 0x1ffff) << 0xc | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0x11;
  *puVar1 = (in[5] & 0x3fff) << 0xf | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 0xe;
  *puVar1 = (in[6] & 0x7ff) << 0x12 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 0xb;
  *puVar1 = (in[7] & 0xff) << 0x15 | *puVar1;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack29_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 26)) << (29 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 23)) << (29 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 20)) << (29 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 17)) << (29 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 14)) << (29 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 11)) << (29 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 8)) << (29 - 8);
  out++;

  return in + 1;
}